

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptRegularExpression.cpp
# Opt level: O2

Var Js::JavascriptRegExp::EntryToString(RecyclableObject *function,CallInfo callInfo,...)

{
  ScriptContext *pSVar1;
  code *pcVar2;
  bool bVar3;
  charcount_t cVar4;
  charcount_t cVar5;
  undefined4 *puVar6;
  RecyclableObject *instance;
  Var pvVar7;
  JavascriptString *this;
  JavascriptString *this_00;
  CompoundString *this_01;
  JavascriptRegExp *this_02;
  int in_stack_00000010;
  CallInfo local_40;
  CallInfo callInfo_local;
  ArgumentReader args;
  
  pSVar1 = (((((function->type).ptr)->javascriptLibrary).ptr)->super_JavascriptLibraryBase).
           scriptContext.ptr;
  local_40 = callInfo;
  ThreadContext::ProbeStack(pSVar1->threadContext,0xc00,pSVar1,(PVOID)0x0);
  if (callInfo._0_4_ != in_stack_00000010) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar6 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptRegularExpression.cpp"
                                ,0x290,
                                "(*reinterpret_cast<Js::CallInfo*>(_argsVarArray - 1) == callInfo)",
                                "*reinterpret_cast<Js::CallInfo*>(_argsVarArray - 1) == callInfo");
    if (!bVar3) goto LAB_00bb1329;
    *puVar6 = 0;
  }
  ArgumentReader::ArgumentReader
            ((ArgumentReader *)&callInfo_local,&local_40,(Var *)&stack0x00000018);
  pSVar1 = (((((function->type).ptr)->javascriptLibrary).ptr)->super_JavascriptLibraryBase).
           scriptContext.ptr;
  if (((ulong)local_40 & 0x1000000) != 0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar6 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptRegularExpression.cpp"
                                ,0x293,"(!(callInfo.Flags & CallFlags_New))",
                                "!(callInfo.Flags & CallFlags_New)");
    if (!bVar3) goto LAB_00bb1329;
    *puVar6 = 0;
  }
  if ((callInfo_local._0_4_ & 0xffffff) == 0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar6 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptRegularExpression.cpp"
                                ,0x294,"(args.Info.Count > 0)","args.Info.Count > 0");
    if (!bVar3) {
LAB_00bb1329:
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    *puVar6 = 0;
  }
  if (((pSVar1->config).threadConfig)->m_ES6RegExPrototypeProperties == true) {
    instance = GetThisObject((Arguments *)&callInfo_local,L"RegExp.prototype.toString",pSVar1);
    pvVar7 = JavascriptOperators::GetProperty(instance,0x153,pSVar1,(PropertyValueInfo *)0x0);
    this = JavascriptConversion::ToString(pvVar7,pSVar1);
    pvVar7 = JavascriptOperators::GetProperty(instance,0x85,pSVar1,(PropertyValueInfo *)0x0);
    this_00 = JavascriptConversion::ToString(pvVar7,pSVar1);
    cVar4 = JavascriptString::GetLength(this);
    cVar5 = JavascriptString::GetLength(this_00);
    this_01 = CompoundString::NewWithCharCapacity
                        (cVar4 + cVar5 + 2,(pSVar1->super_ScriptContextBase).javascriptLibrary);
    CompoundString::Append(this_01,L'/');
    CompoundString::Append(this_01,this);
    CompoundString::Append(this_01,L'/');
    CompoundString::Append(this_01,this_00);
  }
  else {
    this_02 = GetJavascriptRegExp((Arguments *)&callInfo_local,L"RegExp.prototype.toString",pSVar1);
    this_01 = (CompoundString *)ToString(this_02,false);
  }
  return this_01;
}

Assistant:

Var JavascriptRegExp::EntryToString(RecyclableObject* function, CallInfo callInfo, ...)
    {
        PROBE_STACK(function->GetScriptContext(), Js::Constants::MinStackDefault);

        ARGUMENTS(args, callInfo);
        ScriptContext* scriptContext = function->GetScriptContext();

        Assert(!(callInfo.Flags & CallFlags_New));
        Assert(args.Info.Count > 0);

        PCWSTR const varName = _u("RegExp.prototype.toString");

        const ScriptConfiguration* scriptConfig = scriptContext->GetConfig();

        if (scriptConfig->IsES6RegExPrototypePropertiesEnabled())
        {
            RecyclableObject *thisObj = GetThisObject(args, varName, scriptContext);
            JavascriptString* source = JavascriptConversion::ToString(
                JavascriptOperators::GetProperty(thisObj, PropertyIds::source, scriptContext),
                scriptContext);
            JavascriptString* flags = JavascriptConversion::ToString(
                JavascriptOperators::GetProperty(thisObj, PropertyIds::flags, scriptContext),
                scriptContext);

            CharCount length = source->GetLength() + flags->GetLength() + 2; // 2 for the two '/'s
            CompoundString *const builder =
                CompoundString::NewWithCharCapacity(length, scriptContext->GetLibrary());
            builder->Append(_u('/'));
            builder->Append(source);
            builder->Append(_u('/'));
            builder->Append(flags);
            return builder;
        }
        else
        {
            JavascriptRegExp* obj = GetJavascriptRegExp(args, varName, scriptContext);
            bool sourceOnly = false;
            return obj->ToString(sourceOnly);
        }
    }